

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O1

void __thiscall
nuraft::raft_server::handle_peer_resp(raft_server *this,ptr<resp_msg> *resp,ptr<rpc_exception> *err)

{
  uint uVar1;
  msg_type mVar2;
  element_type *peVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar5;
  ulong uVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  element_type *peVar8;
  resp_msg *resp_00;
  context *pcVar9;
  string *psVar10;
  bool bVar11;
  int iVar12;
  undefined8 uVar13;
  _Hash_node_base *p_Var14;
  msg_type type;
  msg_type type_00;
  ulong uVar15;
  __node_base_ptr p_Var16;
  __node_base_ptr p_Var17;
  Param param;
  ptr<peer> pp;
  unique_lock<std::recursive_mutex> guard;
  string local_a8;
  string local_88;
  ptr<peer> local_60;
  ptr<peer> local_50;
  Type local_3c;
  unique_lock<std::recursive_mutex> local_38;
  
  local_38._M_device = &this->lock_;
  local_38._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_38);
  local_38._M_owns = true;
  peVar3 = (err->super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar3 != (element_type *)0x0) {
    peVar4 = (peVar3->req_).super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_00 = (peVar3->req_).super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    uVar1 = (peVar4->super_msg_base).dst_;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    local_88._M_dataplus._M_p = (pointer)0x0;
    local_88._M_string_length = 0;
    uVar6 = (this->peers_)._M_h._M_bucket_count;
    uVar15 = (ulong)(long)(int)uVar1 % uVar6;
    p_Var16 = (this->peers_)._M_h._M_buckets[uVar15];
    p_Var17 = (__node_base_ptr)0x0;
    if ((p_Var16 != (__node_base_ptr)0x0) &&
       (p_Var14 = p_Var16->_M_nxt, p_Var17 = p_Var16, uVar1 != *(uint *)&p_Var16->_M_nxt[1]._M_nxt))
    {
      while (p_Var16 = p_Var14, p_Var14 = p_Var16->_M_nxt, p_Var14 != (_Hash_node_base *)0x0) {
        p_Var17 = (__node_base_ptr)0x0;
        if (((ulong)(long)(int)*(uint *)&p_Var14[1]._M_nxt % uVar6 != uVar15) ||
           (p_Var17 = p_Var16, uVar1 == *(uint *)&p_Var14[1]._M_nxt)) goto LAB_001b0557;
      }
      p_Var17 = (__node_base_ptr)0x0;
    }
LAB_001b0557:
    if (p_Var17 == (__node_base_ptr)0x0) {
      p_Var14 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var14 = p_Var17->_M_nxt;
    }
    if (p_Var14 != (_Hash_node_base *)0x0) {
      local_88._M_dataplus._M_p = (pointer)p_Var14[2]._M_nxt;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_string_length,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(p_Var14 + 3));
    }
    if ((string *)local_88._M_dataplus._M_p == (string *)0x0) {
      iVar12 = 0;
    }
    else {
      LOCK();
      *(int *)(local_88._M_dataplus._M_p + 0x1cc) = *(int *)(local_88._M_dataplus._M_p + 0x1cc) + 1;
      UNLOCK();
      iVar12 = *(int *)(local_88._M_dataplus._M_p + 0x1cc);
      local_50.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_88._M_dataplus._M_p;
      local_50.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_88._M_string_length + 8) =
               *(_Atomic_word *)(local_88._M_string_length + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_88._M_string_length + 8) =
               *(_Atomic_word *)(local_88._M_string_length + 8) + 1;
        }
      }
      check_snapshot_timeout(this,&local_50);
      if (local_50.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_50.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
    }
    if (iVar12 < DAT_005df98c) {
      peVar8 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar8 != (element_type *)0x0) && (iVar12 = (*peVar8->_vptr_logger[7])(), 2 < iVar12)) {
        peVar8 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        uVar13 = (**(code **)(*(long *)(err->
                                       super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_ptr + 0x10))();
        msg_if_given_abi_cxx11_(&local_a8,"peer (%d) response error: %s",(ulong)uVar1,uVar13);
        (*peVar8->_vptr_logger[8])
                  (peVar8,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"handle_peer_resp",0x31e,&local_a8);
LAB_001b06ca:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int32)local_a8._M_dataplus._M_p) !=
            &local_a8.field_2) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,
                                      (int32)local_a8._M_dataplus._M_p));
        }
      }
    }
    else if (((iVar12 == DAT_005df98c) &&
             (peVar8 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr, peVar8 != (element_type *)0x0)) &&
            (iVar12 = (*peVar8->_vptr_logger[7])(), 2 < iVar12)) {
      peVar8 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_a8,"too verbose RPC error on peer (%d), will suppress it from now",
                 (ulong)uVar1);
      (*peVar8->_vptr_logger[8])
                (peVar8,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"handle_peer_resp",0x321,&local_a8);
      goto LAB_001b06ca;
    }
    if (((string *)local_88._M_dataplus._M_p != (string *)0x0) &&
       ((local_88._M_dataplus._M_p[0x1dc] & 1U) != 0)) {
      local_60.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_88._M_dataplus._M_p;
      local_60.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_88._M_string_length + 8) =
               *(_Atomic_word *)(local_88._M_string_length + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_88._M_string_length + 8) =
               *(_Atomic_word *)(local_88._M_string_length + 8) + 1;
        }
      }
      handle_join_leave_rpc_err(this,leave_cluster_request,&local_60);
      if (local_60.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_60.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length);
    }
    goto LAB_001b074f;
  }
  peVar8 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
      (element_type *)0x0) {
    if ((peVar8 != (element_type *)0x0) && (iVar12 = (*peVar8->_vptr_logger[7])(), 4 < iVar12)) {
      peVar8 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_type_to_string_abi_cxx11_
                (&local_88,
                 (nuraft *)
                 (ulong)(((resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr)->super_msg_base).type_,type);
      peVar5 = (resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_a8,
                 "Receive a %s message from peer %d with Result=%d, Term=%lu, NextIndex=%lu",
                 local_88._M_dataplus._M_p,(ulong)(uint)(peVar5->super_msg_base).src_,
                 (ulong)peVar5->accepted_,(peVar5->super_msg_base).term_,peVar5->next_idx_);
      (*peVar8->_vptr_logger[8])
                (peVar8,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"handle_peer_resp",0x337,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int32)local_a8._M_dataplus._M_p) !=
          &local_a8.field_2) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int32)local_a8._M_dataplus._M_p
                                   ));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
    }
    peVar8 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar8 != (element_type *)0x0) && (iVar12 = (*peVar8->_vptr_logger[7])(), 5 < iVar12)) {
      peVar8 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      peVar5 = (resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_a8,"src: %d, dst: %d, resp->get_term(): %d\n",
                 (ulong)(uint)(peVar5->super_msg_base).src_,
                 (ulong)(uint)(peVar5->super_msg_base).dst_,
                 (ulong)(uint)(peVar5->super_msg_base).term_);
      (*peVar8->_vptr_logger[8])
                (peVar8,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"handle_peer_resp",0x33a,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int32)local_a8._M_dataplus._M_p) !=
          &local_a8.field_2) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int32)local_a8._M_dataplus._M_p
                                   ));
      }
    }
    peVar5 = (resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (peVar5->accepted_ == true) {
      iVar12 = (peVar5->super_msg_base).src_;
      uVar6 = (this->peers_)._M_h._M_bucket_count;
      uVar15 = (ulong)(long)iVar12 % uVar6;
      p_Var16 = (this->peers_)._M_h._M_buckets[uVar15];
      p_Var17 = (__node_base_ptr)0x0;
      if ((p_Var16 != (__node_base_ptr)0x0) &&
         (p_Var14 = p_Var16->_M_nxt, p_Var17 = p_Var16, iVar12 != *(int *)&p_Var16->_M_nxt[1]._M_nxt
         )) {
        while (p_Var16 = p_Var14, p_Var14 = p_Var16->_M_nxt, p_Var14 != (_Hash_node_base *)0x0) {
          p_Var17 = (__node_base_ptr)0x0;
          if (((ulong)(long)*(int *)&p_Var14[1]._M_nxt % uVar6 != uVar15) ||
             (p_Var17 = p_Var16, iVar12 == *(int *)&p_Var14[1]._M_nxt)) goto LAB_001b076f;
        }
        p_Var17 = (__node_base_ptr)0x0;
      }
LAB_001b076f:
      if (p_Var17 == (__node_base_ptr)0x0) {
        p_Var14 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var14 = p_Var17->_M_nxt;
      }
      if (p_Var14 != (_Hash_node_base *)0x0) {
        p_Var14 = p_Var14[2]._M_nxt;
        uVar1 = *(uint *)((long)&p_Var14[0x39]._M_nxt + 4);
        if (((DAT_005df98c <= (int)uVar1) &&
            (peVar8 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr, peVar8 != (element_type *)0x0)) &&
           (iVar12 = (*peVar8->_vptr_logger[7])(), 2 < iVar12)) {
          peVar8 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    (&local_a8,"recovered from RPC failure from peer %d, %d errors",
                     (ulong)(uint)(((resp->
                                    super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr)->super_msg_base).src_,(ulong)uVar1);
          (*peVar8->_vptr_logger[8])
                    (peVar8,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"handle_peer_resp",0x344,&local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int32)local_a8._M_dataplus._M_p) !=
              &local_a8.field_2) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,
                                        (int32)local_a8._M_dataplus._M_p));
          }
        }
        LOCK();
        *(undefined4 *)((long)&p_Var14[0x39]._M_nxt + 4) = 0;
        UNLOCK();
        timer_helper::reset((timer_helper *)(p_Var14 + 0x28));
      }
    }
    peVar5 = (resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (((peVar5->super_msg_base).type_ - request_vote_request < 0x17) &&
       (bVar11 = update_term(this,(peVar5->super_msg_base).term_), bVar11)) goto LAB_001b074f;
    resp_00 = (resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    mVar2 = (resp_00->super_msg_base).type_;
    if ((int)mVar2 < 0x11) {
      if (mVar2 == request_vote_response) {
        handle_vote_resp(this,resp_00);
        goto LAB_001b074f;
      }
      if (mVar2 == append_entries_response) {
        local_a8._M_dataplus._M_p._0_4_ = this->id_;
        local_a8._M_dataplus._M_p._4_4_ = (this->leader_).super___atomic_base<int>._M_i;
        local_a8.field_2._M_allocated_capacity =
             (size_type)
             (resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_a8._M_string_length._0_4_ =
             (((element_type *)local_a8.field_2._M_allocated_capacity)->super_msg_base).src_;
        pcVar9 = (this->ctx_)._M_t.
                 super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>._M_t.
                 super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>.
                 super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl;
        if ((pcVar9->cb_func_).func.super__Function_base._M_manager != (_Manager_type)0x0) {
          local_3c = ReceivedAppendEntriesResp;
          local_88._M_dataplus._M_p = (pointer)&local_a8;
          (*(pcVar9->cb_func_).func._M_invoker)
                    ((_Any_data *)&pcVar9->cb_func_,&local_3c,(Param **)&local_88);
        }
        handle_append_entries_resp
                  (this,(resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr);
        goto LAB_001b074f;
      }
      goto switchD_001b086f_caseD_12;
    }
    switch(mVar2) {
    case install_snapshot_response:
      handle_install_snapshot_resp(this,resp_00);
      break;
    case ping_response:
      peVar8 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar8 == (element_type *)0x0) || (iVar12 = (*peVar8->_vptr_logger[7])(), iVar12 < 4))
      break;
      peVar8 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_a8,"got ping response from %d",
                 (ulong)(uint)(((resp->
                                super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr)->super_msg_base).src_);
      (*peVar8->_vptr_logger[8])
                (peVar8,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"handle_peer_resp",0x36e,&local_a8);
      goto LAB_001b0538;
    case pre_vote_response:
      handle_prevote_resp(this,resp_00);
      break;
    case priority_change_response:
      handle_priority_change_resp(this,resp_00);
      break;
    default:
      if (mVar2 == custom_notification_response) {
        handle_custom_notification_resp(this,resp_00);
        break;
      }
    case ping_request:
    case pre_vote_request:
    case other_request:
    case other_response:
    case priority_change_request:
switchD_001b086f_caseD_12:
      peVar8 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar8 != (element_type *)0x0) && (iVar12 = (*peVar8->_vptr_logger[7])(), 1 < iVar12)) {
        peVar8 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_type_to_string_abi_cxx11_
                  (&local_88,
                   (nuraft *)
                   (ulong)(((resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)
                           ._M_ptr)->super_msg_base).type_,type_00);
        msg_if_given_abi_cxx11_
                  (&local_a8,"received an unexpected response: %s, ignore it",
                   local_88._M_dataplus._M_p);
        (*peVar8->_vptr_logger[8])
                  (peVar8,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"handle_peer_resp",0x377,&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int32)local_a8._M_dataplus._M_p) !=
            &local_a8.field_2) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,
                                      (int32)local_a8._M_dataplus._M_p));
        }
        psVar10 = &local_88;
LAB_001b053d:
        paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(&(psVar10->field_2)._M_allocated_capacity)[-2];
        if (paVar7 != &psVar10->field_2) {
          operator_delete(paVar7);
        }
      }
    }
LAB_001b074f:
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_38);
    return;
  }
  if ((peVar8 == (element_type *)0x0) || (iVar12 = (*peVar8->_vptr_logger[7])(), iVar12 < 3))
  goto LAB_001b074f;
  peVar8 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  msg_if_given_abi_cxx11_(&local_a8,"empty peer response");
  (*peVar8->_vptr_logger[8])
            (peVar8,3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
             ,"handle_peer_resp",0x32d,&local_a8);
LAB_001b0538:
  psVar10 = &local_a8;
  goto LAB_001b053d;
}

Assistant:

void raft_server::handle_peer_resp(ptr<resp_msg>& resp, ptr<rpc_exception>& err) {
    recur_lock(lock_);
    if (err) {
        int32 peer_id = err->req()->get_dst();
        ptr<peer> pp = nullptr;
        auto entry = peers_.find(peer_id);
        if (entry != peers_.end()) pp = entry->second;

        int rpc_errs = 0;
        if (pp) {
            pp->inc_rpc_errs();
            rpc_errs = pp->get_rpc_errs();

            check_snapshot_timeout(pp);
        }

        if (rpc_errs < raft_server::raft_limits_.warning_limit_) {
            p_wn("peer (%d) response error: %s", peer_id, err->what());
        } else if (rpc_errs == raft_server::raft_limits_.warning_limit_) {
            p_wn("too verbose RPC error on peer (%d), "
                 "will suppress it from now", peer_id);
        }

        if (pp && pp->is_leave_flag_set()) {
            // If this is to-be-removed server, proceed it without
            // waiting for the response.
            handle_join_leave_rpc_err(msg_type::leave_cluster_request, pp);
        }
        return;
    }

    if (!resp.get()) {
        p_wn("empty peer response");
        return;
    }

    p_db( "Receive a %s message from peer %d with "
          "Result=%d, Term=%" PRIu64 ", NextIndex=%" PRIu64 "",
          msg_type_to_string(resp->get_type()).c_str(),
          resp->get_src(),
          resp->get_accepted() ? 1 : 0,
          resp->get_term(),
          resp->get_next_idx() );

    p_tr("src: %d, dst: %d, resp->get_term(): %d\n",
         (int)resp->get_src(), (int)resp->get_dst(), (int)resp->get_term());

    if (resp->get_accepted()) {
        // On accepted response, reset response timer.
        auto entry = peers_.find(resp->get_src());
        if (entry != peers_.end()) {
            peer* pp = entry->second.get();
            int rpc_errs = pp->get_rpc_errs();
            if (rpc_errs >= raft_server::raft_limits_.warning_limit_) {
                p_wn("recovered from RPC failure from peer %d, %d errors",
                     resp->get_src(), rpc_errs);
            }
            pp->reset_rpc_errs();
            pp->reset_resp_timer();
        }
    }

    if ( is_valid_msg(resp->get_type()) ) {
        bool update_term_succ = update_term(resp->get_term());

        // if term is updated, no more action is required
        if (update_term_succ) return;
    }

    // ignore the response that with lower term for safety
    switch (resp->get_type())
    {
    case msg_type::pre_vote_response:
        handle_prevote_resp(*resp);
        break;

    case msg_type::request_vote_response:
        handle_vote_resp(*resp);
        break;

    case msg_type::append_entries_response:
        {
            cb_func::Param param(id_, leader_, resp->get_src(), resp.get());
            ctx_->cb_func_.call(cb_func::ReceivedAppendEntriesResp, &param);
        }
        handle_append_entries_resp(*resp);
        break;

    case msg_type::install_snapshot_response:
        handle_install_snapshot_resp(*resp);
        break;

    case msg_type::priority_change_response:
        handle_priority_change_resp(*resp);
        break;

    case msg_type::ping_response:
        p_in("got ping response from %d", resp->get_src());
        break;

    case msg_type::custom_notification_response:
        handle_custom_notification_resp(*resp);
        break;

    default:
        p_er( "received an unexpected response: %s, ignore it",
              msg_type_to_string(resp->get_type()).c_str() );
        break;
    }
}